

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O1

HighsStatus __thiscall Highs::callSolveLp(Highs *this,HighsLp *lp,string *message)

{
  pointer pcVar1;
  HighsStatus HVar2;
  HighsLpSolverObject solver_object;
  string local_b0;
  string local_90;
  HighsLpSolverObject local_70;
  
  local_70.basis_ = &this->basis_;
  local_70.solution_ = &this->solution_;
  local_70.highs_info_ = &this->info_;
  local_70.ekk_instance_ = &this->ekk_instance_;
  local_70.callback_ = &this->callback_;
  local_70.options_ = &this->options_;
  local_70.timer_ = &this->timer_;
  local_70.model_status_ = kMin;
  pcVar1 = (message->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_70.lp_ = lp;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + message->_M_string_length);
  HVar2 = solveLp(&local_70,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  this->model_status_ = local_70.model_status_;
  if (local_70.model_status_ == kOptimal) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"LP","");
    HVar2 = checkOptimality(this,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  return HVar2;
}

Assistant:

HighsStatus Highs::callSolveLp(HighsLp& lp, const string message) {
  HighsStatus return_status = HighsStatus::kOk;

  HighsLpSolverObject solver_object(lp, basis_, solution_, info_, ekk_instance_,
                                    callback_, options_, timer_);

  // Check that the model is column-wise
  assert(model_.lp_.a_matrix_.isColwise());

  // Solve the LP
  return_status = solveLp(solver_object, message);
  // Extract the model status
  model_status_ = solver_object.model_status_;
  if (model_status_ == HighsModelStatus::kOptimal) return checkOptimality("LP");
  return return_status;
}